

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  reference pcVar2;
  const_iterator local_208;
  const_iterator local_200;
  _List_node_base *local_1f8;
  allocator local_1e9;
  string local_1e8;
  cmExpandedCommandArgument local_1c8;
  allocator local_199;
  string local_198;
  cmExpandedCommandArgument local_178;
  undefined1 local_149;
  iterator iStack_148;
  bool value;
  _List_node_base *local_140;
  _List_node_base *local_138;
  __normal_iterator<cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_130;
  const_iterator local_128;
  _List_node_base *local_120;
  _List_iterator<cmExpandedCommandArgument> local_118;
  iterator argP1;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  _Self local_a0;
  int local_94;
  _Self _Stack_90;
  uint depth;
  _List_iterator<cmExpandedCommandArgument> local_88;
  iterator argClose;
  allocator local_69;
  string local_68;
  _Self local_48;
  _Self local_40;
  iterator arg;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         begin(newArgs);
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"(",&local_69);
      pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
      bVar1 = IsKeyword(this,&local_68,pcVar2);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (bVar1) {
        std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_88);
        local_88._M_node = local_40._M_node;
        _Stack_90 = std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_88,0);
        local_94 = 1;
        while( true ) {
          local_a0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          bVar1 = std::operator!=(&local_88,&local_a0);
          if (!bVar1 || local_94 == 0) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_c0,"(",&local_c1);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_88);
          bVar1 = IsKeyword(this,&local_c0,pcVar2);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
          if (bVar1) {
            local_94 = local_94 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e8,")",&local_e9);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_88);
          bVar1 = IsKeyword(this,&local_e8,pcVar2);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          if (bVar1) {
            local_94 = local_94 + -1;
          }
          std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_88,0);
        }
        if (local_94 != 0) {
          std::__cxx11::string::operator=
                    ((string *)errorString,"mismatched parenthesis in condition");
          *status = FATAL_ERROR;
          return false;
        }
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
        local_118._M_node = local_40._M_node;
        local_120 = (_List_node_base *)
                    std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_118,0);
        local_130._M_current =
             (cmExpandedCommandArgument *)
             std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         *)&argP1);
        __gnu_cxx::
        __normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>
        ::__normal_iterator<cmExpandedCommandArgument*>
                  ((__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>
                    *)&local_128,&local_130);
        local_138 = local_118._M_node;
        local_140 = local_88._M_node;
        iStack_148 = std::
                     vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
                     insert<std::_List_iterator<cmExpandedCommandArgument>,void>
                               ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>
                                 *)&argP1,local_128,local_118,local_88);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::pop_back
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
        local_149 = IsTrue(this,(vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                 *)&argP1,errorString,status);
        if ((bool)local_149) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_198,"1",&local_199);
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_178,&local_198,true);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
          cmExpandedCommandArgument::operator=(pcVar2,&local_178);
          cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,"0",&local_1e9);
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_1c8,&local_1e8,true);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
          cmExpandedCommandArgument::operator=(pcVar2,&local_1c8);
          cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
        local_118._M_node = local_40._M_node;
        local_1f8 = (_List_node_base *)
                    std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_118,0);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_200,&local_118);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_208,&local_88);
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        erase(newArgs,local_200,local_208);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_40);
    }
    if (arg._M_node._4_4_ == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end())
      {
      if (IsKeyword("(", *arg))
        {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth)
          {
          if (this->IsKeyword("(", *argClose))
            {
              depth++;
            }
          if (this->IsKeyword(")", *argClose))
            {
              depth--;
            }
          argClose++;
          }
        if (depth)
          {
          errorString = "mismatched parenthesis in condition";
          status = cmake::FATAL_ERROR;
          return false;
          }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value =
          this->IsTrue(newArgs2, errorString, status);
        if(value)
          {
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1,argClose);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}